

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O1

void xe::parseTestCaseResultFromData
               (TestResultParser *parser,TestCaseResult *result,TestCaseResultData *data)

{
  string *psVar1;
  pointer puVar2;
  pointer puVar3;
  ParseResult PVar4;
  runtime_error *prVar5;
  char *pcVar6;
  char *pcVar7;
  deUint8 *bytes;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pcVar7 = (data->m_casePath)._M_dataplus._M_p;
  pcVar6 = (char *)(result->super_TestCaseResultHeader).casePath._M_string_length;
  strlen(pcVar7);
  std::__cxx11::string::_M_replace((ulong)result,0,pcVar6,(ulong)pcVar7);
  (result->super_TestCaseResultHeader).caseType = TESTCASETYPE_SELF_VALIDATE;
  (result->super_TestCaseResultHeader).statusCode = data->m_statusCode;
  pcVar7 = (data->m_statusDetails)._M_dataplus._M_p;
  psVar1 = &(result->super_TestCaseResultHeader).statusDetails;
  pcVar6 = (char *)(result->super_TestCaseResultHeader).statusDetails._M_string_length;
  strlen(pcVar7);
  std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar6,(ulong)pcVar7);
  if (*(int *)&(data->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
      *(int *)&(data->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start < 1) {
    if ((result->super_TestCaseResultHeader).statusCode != TESTSTATUSCODE_LAST) goto LAB_00110b76;
    (result->super_TestCaseResultHeader).statusCode = TESTSTATUSCODE_TERMINATED;
    pcVar7 = (char *)(result->super_TestCaseResultHeader).statusDetails._M_string_length;
    pcVar6 = "Empty test case result";
  }
  else {
    TestResultParser::clear(parser);
    parser->m_result = result;
    parser->m_state = STATE_INITIALIZED;
    parser->m_curItemList = &result->resultItems;
    puVar2 = (data->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (data->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bytes = (deUint8 *)0x0;
    if (puVar2 != puVar3) {
      bytes = puVar2;
    }
    PVar4 = TestResultParser::parse(parser,bytes,(int)puVar3 - (int)puVar2);
    if ((result->super_TestCaseResultHeader).statusCode != TESTSTATUSCODE_LAST) goto LAB_00110b76;
    (result->super_TestCaseResultHeader).statusCode = TESTSTATUSCODE_INTERNAL_ERROR;
    pcVar7 = (char *)(result->super_TestCaseResultHeader).statusDetails._M_string_length;
    if (PVar4 == PARSERESULT_COMPLETE) {
      pcVar6 = "Test case result is missing <Result> item";
    }
    else if (PVar4 == PARSERESULT_ERROR) {
      pcVar6 = "Test case result parsing failed";
    }
    else {
      pcVar6 = "Incomplete test case result";
    }
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar7,(ulong)pcVar6);
LAB_00110b76:
  if ((result->super_TestCaseResultHeader).casePath._M_string_length == 0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Empty test case path in result","");
    std::runtime_error::runtime_error(prVar5,(string *)local_50);
    *(undefined ***)prVar5 = &PTR__runtime_error_0011b028;
    __cxa_throw(prVar5,&Error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((result->super_TestCaseResultHeader).caseType != TESTCASETYPE_LAST) {
    return;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Invalid test case type in result","");
  std::runtime_error::runtime_error(prVar5,(string *)local_50);
  *(undefined ***)prVar5 = &PTR__runtime_error_0011b028;
  __cxa_throw(prVar5,&Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void parseTestCaseResultFromData (TestResultParser* parser, TestCaseResult* result, const TestCaseResultData& data)
{
	DE_ASSERT(result->resultItems.getNumItems() == 0);

	// Initialize status codes etc. from data.
	result->casePath		= data.getTestCasePath();
	result->caseType		= TESTCASETYPE_SELF_VALIDATE;
	result->statusCode		= data.getStatusCode();
	result->statusDetails	= data.getStatusDetails();

	if (data.getDataSize() > 0)
	{
		parser->init(result);

		const TestResultParser::ParseResult parseResult = parser->parse(data.getData(), data.getDataSize());

		if (result->statusCode == TESTSTATUSCODE_LAST)
		{
			result->statusCode = TESTSTATUSCODE_INTERNAL_ERROR;

			if (parseResult == TestResultParser::PARSERESULT_ERROR)
				result->statusDetails = "Test case result parsing failed";
			else if (parseResult != TestResultParser::PARSERESULT_COMPLETE)
				result->statusDetails = "Incomplete test case result";
			else
				result->statusDetails = "Test case result is missing <Result> item";
		}
	}
	else if (result->statusCode == TESTSTATUSCODE_LAST)
	{
		result->statusCode		= TESTSTATUSCODE_TERMINATED;
		result->statusDetails	= "Empty test case result";
	}

	if (result->casePath.empty())
		throw Error("Empty test case path in result");

	if (result->caseType == TESTCASETYPE_LAST)
		throw Error("Invalid test case type in result");

	DE_ASSERT(result->statusCode != TESTSTATUSCODE_LAST);
}